

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_cache_utils.c
# Opt level: O3

int VP8LColorCacheInit(VP8LColorCache *color_cache,int hash_bits)

{
  uint32_t *puVar1;
  
  puVar1 = (uint32_t *)WebPSafeCalloc((long)(1 << ((byte)hash_bits & 0x1f)),4);
  color_cache->colors = puVar1;
  if (puVar1 != (uint32_t *)0x0) {
    color_cache->hash_shift = 0x20 - hash_bits;
    color_cache->hash_bits = hash_bits;
  }
  return (uint)(puVar1 != (uint32_t *)0x0);
}

Assistant:

int VP8LColorCacheInit(VP8LColorCache* const color_cache, int hash_bits) {
  const int hash_size = 1 << hash_bits;
  assert(color_cache != NULL);
  assert(hash_bits > 0);
  color_cache->colors = (uint32_t*)WebPSafeCalloc(
      (uint64_t)hash_size, sizeof(*color_cache->colors));
  if (color_cache->colors == NULL) return 0;
  color_cache->hash_shift = 32 - hash_bits;
  color_cache->hash_bits = hash_bits;
  return 1;
}